

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O2

Type * __thiscall
soul::HEARTGenerator::getArrayOrVectorType
          (Type *__return_storage_ptr__,HEARTGenerator *this,ArrayElementRef *a)

{
  Expression *pEVar1;
  CompileMessage CStack_48;
  
  pEVar1 = pool_ptr<soul::AST::Expression>::operator->(&a->object);
  (*(pEVar1->super_Statement).super_ASTObject._vptr_ASTObject[4])(__return_storage_ptr__,pEVar1);
  if ((__return_storage_ptr__->category & ~primitive) == vector) {
    return __return_storage_ptr__;
  }
  pEVar1 = pool_ptr<soul::AST::Expression>::operator->(&a->object);
  Errors::expectedArrayOrVectorForBracketOp<>();
  AST::Context::throwError(&(pEVar1->super_Statement).super_ASTObject.context,&CStack_48,false);
}

Assistant:

Type getArrayOrVectorType (AST::ArrayElementRef& a)
    {
        auto arrayOrVectorType = a.object->getResultType();

        if (! arrayOrVectorType.isArrayOrVector())
            a.object->context.throwError (Errors::expectedArrayOrVectorForBracketOp());

        return arrayOrVectorType;
    }